

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void handle_shortcut_key(nes_system *system,SDL_Scancode key)

{
  int iVar1;
  long lVar2;
  size_t __size;
  
  lVar2 = SDL_GetKeyboardState(0);
  if (*(char *)(lVar2 + 0xe4) != '\0' || *(char *)(lVar2 + 0xe0) != '\0') {
    if (key != SDL_SCANCODE_L) {
      if (key == SDL_SCANCODE_R) {
LAB_00102b73:
        nes_system_reset(system);
        return;
      }
      if (key == SDL_SCANCODE_S) {
LAB_00102b5e:
        __size = state_buffer_size;
        if (state_buffer == (void *)0x0) {
          __size = nes_system_get_state_size(system);
          state_buffer_size = __size;
          state_buffer = malloc(__size);
        }
        iVar1 = nes_system_save_state(system,state_buffer,__size);
        if (iVar1 == 0) {
          fwrite("Save state failed\n",0x12,1,_stderr);
        }
        write_save();
        return;
      }
      if (key == SDL_SCANCODE_EQUALS) {
        iVar1 = 1;
      }
      else {
        if (key != SDL_SCANCODE_MINUS) {
          return;
        }
        iVar1 = -1;
      }
      wnd_scale = wnd_scale + iVar1;
      SDL_SetWindowSize(wnd,wnd_scale * 0x100,wnd_scale * 0xe0);
      if (key != SDL_SCANCODE_L) {
        if (key == SDL_SCANCODE_R) goto LAB_00102b73;
        if (key != SDL_SCANCODE_S) {
          return;
        }
        goto LAB_00102b5e;
      }
    }
    read_save();
    if ((state_buffer != (void *)0x0) &&
       (iVar1 = nes_system_load_state(system,state_buffer,state_buffer_size), iVar1 == 0)) {
      fwrite("Load state failed\n",0x12,1,_stderr);
      return;
    }
  }
  return;
}

Assistant:

void handle_shortcut_key(nes_system* system, SDL_Scancode key)
{
    const uint8_t* keys = SDL_GetKeyboardState(0);
    int is_ctrl_down = keys[SDL_SCANCODE_LCTRL] | keys[SDL_SCANCODE_RCTRL];
    if (is_ctrl_down)
    {
        int scale = wnd_scale;
        if (key == SDL_SCANCODE_EQUALS) wnd_scale++;
        else if(key == SDL_SCANCODE_MINUS) wnd_scale--;

        if (scale != wnd_scale)
        {
            SDL_SetWindowSize(wnd, TEXTURE_WIDTH * wnd_scale, TEXTURE_HEIGHT * wnd_scale);
        }

        if (key == SDL_SCANCODE_S)
        {
            if (!state_buffer)
            {
                state_buffer_size   = nes_system_get_state_size(system);
                state_buffer        = malloc(state_buffer_size);
            }

            if (!nes_system_save_state(system, state_buffer, state_buffer_size))
                fprintf(stderr, "Save state failed\n");

            write_save();
        }
        else if (key == SDL_SCANCODE_L)
        {
            read_save();

            if (state_buffer)
            {
                if (!nes_system_load_state(system, state_buffer, state_buffer_size))
                    fprintf(stderr, "Load state failed\n");
            }
        }
        else if (key == SDL_SCANCODE_R)
        {
            nes_system_reset(system);
        }
    }
}